

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_window_is_any_hovered(nk_context *ctx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  nk_window *pnVar12;
  bool bVar13;
  nk_window *pnVar14;
  
  if ((ctx != (nk_context *)0x0) && (pnVar14 = ctx->begin, pnVar14 != (nk_window *)0x0)) {
    fVar1 = (ctx->input).mouse.pos.x;
    do {
      uVar4 = (pnVar14->bounds).x;
      uVar8 = (pnVar14->bounds).y;
      uVar5 = (pnVar14->bounds).w;
      uVar9 = (pnVar14->bounds).h;
      bVar13 = fVar1 <= (float)uVar5 + (float)uVar4;
      if ((pnVar14->flags & 0x4000) == 0) {
        if ((((float)uVar4 <= fVar1 && bVar13) &&
            (fVar2 = (ctx->input).mouse.pos.y, (float)uVar8 <= fVar2)) &&
           (fVar2 <= (float)uVar9 + (float)uVar8)) {
          return 1;
        }
      }
      else if ((((float)uVar4 <= fVar1 && bVar13) &&
               (fVar2 = (ctx->input).mouse.pos.y, (float)uVar8 <= fVar2)) &&
              (fVar3 = (ctx->style).window.header.padding.y,
              fVar2 <= (float)uVar8 + fVar3 + fVar3 + ((ctx->style).font)->height)) {
        return 1;
      }
      if (((pnVar14->popup).active != 0) &&
         (pnVar12 = (pnVar14->popup).win, pnVar12 != (nk_window *)0x0)) {
        uVar6 = (pnVar12->bounds).x;
        uVar10 = (pnVar12->bounds).y;
        if (((float)uVar6 <= fVar1) &&
           (uVar7 = (pnVar12->bounds).w, uVar11 = (pnVar12->bounds).h,
           fVar1 <= (float)uVar6 + (float)uVar7)) {
          fVar2 = (ctx->input).mouse.pos.y;
          if (((float)uVar10 <= fVar2) && (fVar2 <= (float)uVar10 + (float)uVar11)) {
            return 1;
          }
        }
      }
      pnVar14 = pnVar14->next;
    } while (pnVar14 != (nk_window *)0x0);
  }
  return 0;
}

Assistant:

NK_API int
nk_window_is_any_hovered(struct nk_context *ctx)
{
    struct nk_window *iter;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    iter = ctx->begin;
    while (iter) {
        /* check if window is being hovered */
        if (iter->flags & NK_WINDOW_MINIMIZED) {
            struct nk_rect header = iter->bounds;
            header.h = ctx->style.font->height + 2 * ctx->style.window.header.padding.y;
            if (nk_input_is_mouse_hovering_rect(&ctx->input, header))
                return 1;
        } else if (nk_input_is_mouse_hovering_rect(&ctx->input, iter->bounds)) {
            return 1;
        }
        /* check if window popup is being hovered */
        if (iter->popup.active && iter->popup.win && nk_input_is_mouse_hovering_rect(&ctx->input, iter->popup.win->bounds))
            return 1;
        iter = iter->next;
    }
    return 0;
}